

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O3

void UpdateRootMove(int num_of_all_movements,Movement *all_movements,Movement *move)

{
  UINT32 UVar1;
  UINT32 UVar2;
  long lVar3;
  
  if (0 < num_of_all_movements) {
    UVar2 = move->value;
    lVar3 = 0;
    do {
      if (((move->from == (&all_movements->from)[lVar3]) &&
          (move->to == (&all_movements->to)[lVar3])) &&
         (UVar1 = 0x80000000, move->capture == (&all_movements->capture)[lVar3])) {
LAB_001072d5:
        UVar2 = UVar1;
        move->value = UVar2;
      }
      else {
        if (UVar2 != 0) {
          UVar1 = UVar2 - 1;
          goto LAB_001072d5;
        }
        UVar2 = 0;
      }
      lVar3 = lVar3 + 0xc;
    } while ((ulong)(uint)num_of_all_movements * 0xc != lVar3);
  }
  return;
}

Assistant:

void UpdateRootMove(int num_of_all_movements, Movement* all_movements, Movement& move){
    for(int i = 0; i < num_of_all_movements; i++){
        if(isMoveEqual(move, all_movements[i])){
            move.value = MAX_MOVE_VALUE;
        }
        else if(move.value){
            move.value--;
        }
    }
}